

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

ErrorOr<llvm::MD5::MD5Result> *
llvm::sys::fs::md5_contents(ErrorOr<llvm::MD5::MD5Result> *__return_storage_ptr__,int FD)

{
  int iVar1;
  void *__s;
  ssize_t sVar2;
  int *piVar3;
  undefined8 uVar4;
  uchar *in_RCX;
  size_t in_RDX;
  undefined4 in_register_00000034;
  value_type_conflict5 *__val;
  ArrayRef<unsigned_char> Data;
  MD5 Hash;
  MD5 MStack_b8;
  
  MD5::MD5(&MStack_b8,(uchar *)CONCAT44(in_register_00000034,FD),in_RDX,in_RCX);
  __s = operator_new(0x1000);
  memset(__s,0,0x1000);
  sVar2 = read(FD,__s,0x1000);
  iVar1 = (int)sVar2;
  while (0 < iVar1) {
    Data.Length._0_4_ = (uint)sVar2 & 0x7fffffff;
    Data.Data = (uchar *)__s;
    Data.Length._4_4_ = 0;
    MD5::update(&MStack_b8,Data);
    sVar2 = read(FD,__s,0x1000);
    iVar1 = (int)sVar2;
  }
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    uVar4 = std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = iVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar4;
  }
  else {
    MD5::final(&MStack_b8,(MD5Result *)__return_storage_ptr__);
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
  }
  operator_delete(__s,0x1000);
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<MD5::MD5Result> md5_contents(int FD) {
  MD5 Hash;

  constexpr size_t BufSize = 4096;
  std::vector<uint8_t> Buf(BufSize);
  int BytesRead = 0;
  for (;;) {
    BytesRead = read(FD, Buf.data(), BufSize);
    if (BytesRead <= 0)
      break;
    Hash.update(makeArrayRef(Buf.data(), BytesRead));
  }

  if (BytesRead < 0)
    return std::error_code(errno, std::generic_category());
  MD5::MD5Result Result;
  Hash.final(Result);
  return Result;
}